

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl.c
# Opt level: O1

void cfl_load_dc_pred(MACROBLOCKD *xd,uint8_t *dst,int dst_stride,TX_SIZE tx_size,
                     CFL_PRED_TYPE pred_plane)

{
  void *__src;
  int iVar1;
  undefined7 in_register_00000009;
  ulong uVar2;
  void *__dest;
  int iVar3;
  undefined7 in_register_00000081;
  
  uVar2 = (ulong)(uint)((int)CONCAT71(in_register_00000009,tx_size) << 2);
  iVar1 = *(int *)((long)tx_size_wide + uVar2);
  iVar3 = *(int *)((long)tx_size_high + uVar2);
  __src = (void *)((long)(xd->cfl).dc_pred_cache[0] +
                  (ulong)(uint)((int)CONCAT71(in_register_00000081,pred_plane) << 6));
  if ((xd->cur_buf->flags & 8) == 0) {
    do {
      memcpy(dst,__src,(long)iVar1);
      dst = dst + dst_stride;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  else {
    __dest = (void *)((long)dst * 2);
    do {
      memcpy(__dest,__src,(long)(iVar1 * 2));
      __dest = (void *)((long)__dest + (long)dst_stride * 2);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  return;
}

Assistant:

void cfl_load_dc_pred(MACROBLOCKD *const xd, uint8_t *dst, int dst_stride,
                      TX_SIZE tx_size, CFL_PRED_TYPE pred_plane) {
  const int width = tx_size_wide[tx_size];
  const int height = tx_size_high[tx_size];
  assert(pred_plane < CFL_PRED_PLANES);
  assert(width <= CFL_BUF_LINE);
  assert(height <= CFL_BUF_LINE);
  if (is_cur_buf_hbd(xd)) {
    uint16_t *dst_16 = CONVERT_TO_SHORTPTR(dst);
    cfl_load_dc_pred_hbd(xd->cfl.dc_pred_cache[pred_plane], dst_16, dst_stride,
                         width, height);
    return;
  }
  cfl_load_dc_pred_lbd(xd->cfl.dc_pred_cache[pred_plane], dst, dst_stride,
                       width, height);
}